

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.c
# Opt level: O1

int lyd_wd_toprint(lyd_node *node,int options)

{
  byte bVar1;
  lys_node *plVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  lyd_node *plVar6;
  lyd_node_leaf_list *plVar7;
  lyd_node *plVar8;
  lyd_node_leaf_list *node_00;
  lyd_node_leaf_list *plVar9;
  
  bVar1 = node->field_0x9;
  if ((options & 0x10U) == 0) {
    if (((options & 0xe0U) == 0 && (bVar1 & 1) != 0) &&
       (plVar8 = node, (node->schema->flags & 2) == 0)) {
      do {
        if ((plVar8->schema->flags & 2) != 0) {
          return 1;
        }
        if ((plVar8->schema->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
          plVar6 = plVar8->child;
        }
        else {
          plVar6 = (lyd_node *)0x0;
        }
        if (plVar6 == (lyd_node *)0x0) {
          if (plVar8 == node) {
            return 0;
          }
          plVar6 = plVar8->next;
        }
        if (plVar6 == (lyd_node *)0x0) {
          do {
            plVar8 = plVar8->parent;
            if (plVar8->parent == node->parent) break;
            plVar6 = plVar8->next;
          } while (plVar6 == (lyd_node *)0x0);
        }
        plVar8 = plVar6;
      } while (plVar6 != (lyd_node *)0x0);
    }
    else {
      if ((bVar1 & 1) == 0) {
        return 1;
      }
      if ((options & 4U) != 0) {
        return 1;
      }
      plVar8 = node;
      if (node->schema->nodetype != LYS_CONTAINER) {
        return 1;
      }
      do {
        if (plVar8->schema->nodetype != LYS_CONTAINER) {
          return 1;
        }
        plVar6 = plVar8->child;
        if (plVar6 == (lyd_node *)0x0) {
          if (plVar8 == node) {
            return 0;
          }
          plVar6 = plVar8->next;
        }
        if (plVar6 == (lyd_node *)0x0) {
          do {
            plVar8 = plVar8->parent;
            if (plVar8->parent == node->parent) break;
            plVar6 = plVar8->next;
          } while (plVar6 == (lyd_node *)0x0);
        }
        plVar8 = plVar6;
      } while (plVar6 != (lyd_node *)0x0);
    }
    return 0;
  }
  if ((bVar1 & 1) != 0) {
    return 0;
  }
  plVar2 = node->schema;
  if ((plVar2->nodetype & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) {
    iVar5 = lyd_wd_default((lyd_node_leaf_list *)node);
    if (iVar5 == 0) {
      return 1;
    }
    return 0;
  }
  if ((plVar2->nodetype & LYS_CONTAINER) == LYS_UNKNOWN) {
    return 1;
  }
  lVar3._0_2_ = plVar2[1].flags;
  lVar3._2_1_ = plVar2[1].ext_size;
  lVar3._3_1_ = plVar2[1].iffeature_size;
  lVar3._4_1_ = plVar2[1].padding[0];
  lVar3._5_1_ = plVar2[1].padding[1];
  lVar3._6_1_ = plVar2[1].padding[2];
  lVar3._7_1_ = plVar2[1].padding[3];
  if (lVar3 != 0) {
    return 1;
  }
  node_00 = (lyd_node_leaf_list *)node->child;
  if (node_00 == (lyd_node_leaf_list *)0x0) {
    return 0;
  }
  bVar4 = false;
  plVar9 = node_00;
LAB_00166aef:
  do {
    if ((node_00->field_0x9 & 1) == 0) {
      if (((node_00->schema->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) ||
         (iVar5 = lyd_wd_default(node_00), iVar5 != 0)) {
        if ((node_00->schema->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
          plVar7 = (lyd_node_leaf_list *)node_00->value_str;
        }
        else {
          plVar7 = (lyd_node_leaf_list *)0x0;
        }
        if (plVar7 == (lyd_node_leaf_list *)0x0) goto LAB_00166b25;
        goto LAB_00166b2e;
      }
      bVar4 = true;
    }
    else {
LAB_00166b25:
      if (node_00 != plVar9) {
        plVar7 = (lyd_node_leaf_list *)node_00->next;
LAB_00166b2e:
        if (plVar7 == (lyd_node_leaf_list *)0x0) {
          for (plVar8 = node_00->parent;
              (plVar8->parent != plVar9->parent &&
              (plVar7 = (lyd_node_leaf_list *)plVar8->next, plVar7 == (lyd_node_leaf_list *)0x0));
              plVar8 = plVar8->parent) {
          }
        }
        node_00 = plVar7;
        if (plVar7 != (lyd_node_leaf_list *)0x0) goto LAB_00166aef;
      }
    }
    node_00 = (lyd_node_leaf_list *)plVar9->next;
    if ((node_00 == (lyd_node_leaf_list *)0x0) || (plVar9 = node_00, bVar4)) {
      if (bVar4) {
        return 1;
      }
      return 0;
    }
  } while( true );
}

Assistant:

int
lyd_wd_toprint(const struct lyd_node *node, int options)
{
    const struct lyd_node *subroot, *next, *elem;
    int flag = 0;

    if (options & LYP_WD_TRIM) {
        /* do not print default nodes */
        if (node->dflt) {
            /* implicit default node */
            return 0;
        } else if (node->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST)) {
            if (lyd_wd_default((struct lyd_node_leaf_list *)node)) {
                /* explicit default node */
                return 0;
            }
        } else if ((node->schema->nodetype & (LYS_CONTAINER)) && !((struct lys_node_container *)node->schema)->presence) {
            /* get know if non-presence container contains non-default node */
            for (subroot = node->child; subroot && !flag; subroot = subroot->next) {
                LY_TREE_DFS_BEGIN(subroot, next, elem) {
                    if (elem->dflt) {
                        /* skip subtree */
                        goto trim_dfs_nextsibling;
                    } else if (elem->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST)) {
                        if (!lyd_wd_default((struct lyd_node_leaf_list *)elem)) {
                            /* non-default node */
                            flag = 1;
                            break;
                        }
                    }

                    /* modified LY_TREE_DFS_END */
                    /* select element for the next run - children first */
                    /* child exception for leafs, leaflists and anyxml without children */
                    if (elem->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA)) {
                        next = NULL;
                    } else {
                        next = elem->child;
                    }
                    if (!next) {
trim_dfs_nextsibling:
                        /* no children */
                        if (elem == subroot) {
                            /* we are done, (START) has no children */
                            break;
                        }
                        /* try siblings */
                        next = elem->next;
                    }
                    while (!next) {
                        /* parent is already processed, go to its sibling */
                        elem = elem->parent;
                        /* no siblings, go back through parents */
                        if (elem->parent == subroot->parent) {
                            /* we are done, no next element to process */
                            break;
                        }
                        next = elem->next;
                    }
                }
            }
            if (!flag) {
                /* only default nodes in subtree, do not print the container */
                return 0;
            }
        }
    } else if (node->dflt && !(options & LYP_WD_MASK) && !(node->schema->flags & LYS_CONFIG_R)) {
        /* LYP_WD_EXPLICIT
         * - print only if it contains status data in its subtree */
        LY_TREE_DFS_BEGIN(node, next, elem) {
            if (elem->schema->flags & LYS_CONFIG_R) {
                flag = 1;
                break;
            }
            LY_TREE_DFS_END(node, next, elem)
        }
        if (!flag) {
            return 0;
        }
    } else if (node->dflt && node->schema->nodetype == LYS_CONTAINER && !(options & LYP_KEEPEMPTYCONT)) {
        /* avoid empty default containers */
        LY_TREE_DFS_BEGIN(node, next, elem) {
            if (elem->schema->nodetype != LYS_CONTAINER) {
                flag = 1;
                break;
            }
            LY_TREE_DFS_END(node, next, elem)
        }
        if (!flag) {
            return 0;
        }
    }

    return 1;
}